

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ChElementHexaANCF_3813_9
          (ChElementHexaANCF_3813_9 *this,void **vtt)

{
  ChLoadableUVW CVar1;
  _func_int **pp_Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  
  auVar3 = ZEXT816(0) << 0x40;
  (this->super_ChElementHexahedron)._vptr_ChElementHexahedron =
       (_func_int **)&PTR__ChElementHexahedron_01180e88;
  (this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase =
       (_func_int **)&PTR__ChElementGeneric_0117f7d0;
  (this->super_ChElementGeneric).Kmatr.super_ChKblock._vptr_ChKblock =
       (_func_int **)&PTR__ChKblockGeneric_01186748;
  auVar4 = ZEXT1632(auVar3);
  (this->super_ChElementGeneric).Kmatr.K = (ChMatrixDynamic<double>)auVar4._0_24_;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar4._24_8_;
  *(undefined1 (*) [32])
   &(this->super_ChElementGeneric).Kmatr.K.
    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = auVar4;
  CVar1 = *(ChLoadableUVW *)(vtt + 1);
  this->super_ChLoadableUVW = CVar1;
  *(void **)((long)(this->m_dimensions).m_data + *(long *)((long)CVar1 + -0x78) + -0x58) = vtt[2];
  pp_Var2 = (_func_int **)*vtt;
  (this->super_ChElementHexahedron)._vptr_ChElementHexahedron = pp_Var2;
  (this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase = (_func_int **)0x1181990;
  this->super_ChLoadableUVW = *(ChLoadableUVW *)(vtt + 3);
  *(void **)(pp_Var2[-3] + (long)&(this->super_ChElementHexahedron)._vptr_ChElementHexahedron) =
       vtt[4];
  (this->m_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_central_node).super___shared_ptr<chrono::fea::ChNodeFEAcurv,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_central_node).super___shared_ptr<chrono::fea::ChNodeFEAcurv,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_material).super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->m_material).super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_dimensions).m_data[0] = 0.0;
  (this->m_dimensions).m_data[1] = 0.0;
  (this->m_dimensions).m_data[2] = 0.0;
  (this->m_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_central_node).super___shared_ptr<chrono::fea::ChNodeFEAcurv,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_central_node).super___shared_ptr<chrono::fea::ChNodeFEAcurv,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_material).super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->m_material).super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_dimensions).m_data[0] = 0.0;
  this->m_DPVector1 = (ChVectorDynamic<double>)SUB3216(ZEXT1632(auVar3),0);
  this->m_DPVector2 = (ChVectorDynamic<double>)SUB3216(ZEXT1632(auVar3),0x10);
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ::resize(&this->m_nodes,8);
  Eigen::DenseBase<Eigen::Matrix<double,_11,_11,_1,_11,_11>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_11,_11,_1,_11,_11>_> *)&this->m_ddT);
  Eigen::DenseBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_> *)&this->m_d_dt);
  Eigen::DenseBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_> *)&this->m_Alpha_Plast);
  Eigen::DenseBase<Eigen::Matrix<double,_9,_8,_1,_9,_8>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_9,_8,_1,_9,_8>_> *)&this->m_CCPinv_Plast);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->m_DPVector1);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->m_DPVector2);
  return;
}

Assistant:

ChElementHexaANCF_3813_9::ChElementHexaANCF_3813_9() {
    m_nodes.resize(8);

    m_ddT.setZero();
    m_d_dt.setZero();

    m_Alpha_Plast.setZero();
    m_CCPinv_Plast.setZero();

    m_DPVector1.setZero();
    m_DPVector2.setZero();
}